

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall tetgenio::load_ply(tetgenio *this,char *filebasename)

{
  tetgenio *ptVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  FILE *__stream;
  byte *pbVar6;
  ulong uVar7;
  byte *pbVar8;
  polygon *ppVar9;
  int *piVar10;
  long lVar11;
  double *pdVar12;
  facet *pfVar13;
  uint uVar14;
  char *pcVar15;
  char *result_2;
  long lVar16;
  char *result;
  ulong uVar17;
  double dVar18;
  char infilename [1024];
  char buffer [2048];
  uint local_c7c;
  byte *local_c78;
  long local_c70;
  int local_c64;
  long local_c60;
  FILE *local_c58;
  tetgenio *local_c50;
  ulong local_c48;
  uint local_c40;
  uint local_c3c;
  char local_c38 [4];
  undefined1 auStack_c34 [1019];
  undefined1 local_839;
  char local_838 [2056];
  
  strncpy(local_c38,filebasename,0x3ff);
  local_839 = 0;
  if (local_c38[0] == '\0') {
    puts("Error:  No filename.");
  }
  else {
    sVar5 = strlen(local_c38);
    iVar3 = strcmp(local_c38 + (sVar5 - 4),".ply");
    if (iVar3 != 0) {
      sVar5 = strlen(local_c38);
      builtin_strncpy(local_c38 + sVar5,".ply",4);
      auStack_c34[sVar5] = 0;
    }
    __stream = fopen(local_c38,"r");
    if (__stream == (FILE *)0x0) {
      printf("Error:  Unable to open file %s\n",local_c38);
    }
    else {
      local_c60 = 0;
      local_c50 = this;
      printf("Opening %s.\n",local_c38);
      pbVar6 = (byte *)fgets(local_838,0x7ff,__stream);
      local_c48 = 0;
      local_c70 = 0;
      uVar17 = 0;
      local_c7c = 0;
      if (pbVar6 != (byte *)0x0) {
        local_c40 = 1;
        uVar14 = 1;
        local_c7c = 0;
        uVar17 = 0;
        local_c70 = 0;
        local_c48 = 0;
        local_c60 = 0;
        local_c64 = 0;
        local_c58 = __stream;
LAB_00110be7:
        for (; uVar7 = (ulong)*pbVar6, uVar7 < 0x21; pbVar6 = pbVar6 + 1) {
          if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
            if ((0x2401UL >> (uVar7 & 0x3f) & 1) == 0) break;
            pbVar6 = (byte *)fgets(local_838,0x7ff,__stream);
            goto joined_r0x0011120b;
          }
        }
        uVar4 = (uint)uVar17;
        local_c78 = pbVar6;
        local_c3c = uVar4;
        if ((local_c40 & 1) != 0) {
          pcVar15 = strstr((char *)pbVar6,"end_header");
          if (((pcVar15 != (char *)0x0) ||
              (pcVar15 = strstr((char *)pbVar6,"End_header"), pcVar15 != (char *)0x0)) ||
             (pcVar15 = strstr((char *)pbVar6,"End_Header"), pcVar15 != (char *)0x0)) {
            pbVar6 = (byte *)fgets(local_838,0x7ff,__stream);
            local_c40 = 0;
            goto joined_r0x0011120b;
          }
          if ((((int)local_c60 == 0) || ((int)local_c70 == 0)) &&
             ((pbVar8 = (byte *)strstr((char *)pbVar6,"element"), pbVar8 != (byte *)0x0 ||
              (pbVar8 = (byte *)strstr((char *)pbVar6,"Element"), pbVar8 != (byte *)0x0)))) {
            iVar3 = (int)local_c70;
            while ((uVar17 = (ulong)*pbVar8, 0x3b < uVar17 ||
                   ((0x800100100000201U >> (uVar17 & 0x3f) & 1) == 0))) {
              pbVar8 = pbVar8 + 1;
            }
            while (((byte)uVar17 < 0x3c && ((0x800100100000200U >> (uVar17 & 0x3f) & 1) != 0))) {
              pbVar6 = pbVar8 + 1;
              pbVar8 = pbVar8 + 1;
              uVar17 = (ulong)*pbVar6;
            }
            local_c78 = pbVar8;
            if ((byte)uVar17 == 0) {
              pcVar15 = "Syntax error reading element type on line%d in file %s\n";
LAB_00111370:
              printf(pcVar15,(ulong)uVar14,local_c38);
              goto LAB_00111292;
            }
            if ((int)local_c60 == 0) {
              pbVar6 = (byte *)strstr((char *)pbVar8,"vertex");
              if ((pbVar6 == (byte *)0x0) &&
                 (pbVar6 = (byte *)strstr((char *)pbVar8,"Vertex"), pbVar6 == (byte *)0x0)) {
                local_c60 = 0;
              }
              else {
                while ((uVar17 = (ulong)*pbVar6, 0x2c < uVar17 ||
                       ((0x100900000201U >> (uVar17 & 0x3f) & 1) == 0))) {
                  pbVar6 = pbVar6 + 1;
                }
                while (bVar2 = (byte)uVar17, 0x2e < bVar2) {
LAB_00110e63:
                  if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_00111006;
                  pbVar8 = pbVar6 + 1;
                  pbVar6 = pbVar6 + 1;
                  uVar17 = (ulong)*pbVar8;
                }
                if ((0x680000000001U >> (uVar17 & 0x3f) & 1) == 0) {
                  if (uVar17 != 0x23) goto LAB_00110e63;
                  *pbVar6 = 0;
LAB_0011129f:
                  pcVar15 = "Syntax error reading vertex number on line";
                  goto LAB_001112b2;
                }
                local_c78 = pbVar6;
                if (bVar2 == 0) goto LAB_0011129f;
LAB_00111006:
                local_c78 = pbVar6;
                local_c60 = strtol((char *)pbVar6,(char **)&local_c78,0);
                ptVar1 = local_c50;
                iVar3 = (int)local_c60;
                if (iVar3 < 1) {
                  iVar3 = (int)local_c70;
                }
                else {
                  local_c50->numberofpoints = iVar3;
                  pdVar12 = (double *)operator_new__(local_c60 * 0x18 & 0x7fffffff8);
                  ptVar1->pointlist = pdVar12;
                  local_c7c = iVar3 + 1;
                  iVar3 = (int)local_c70;
                }
              }
            }
            pbVar6 = local_c78;
            if (iVar3 == 0) {
              pbVar8 = (byte *)strstr((char *)local_c78,"face");
              if ((pbVar8 != (byte *)0x0) ||
                 (pbVar8 = (byte *)strstr((char *)pbVar6,"Face"), pbVar8 != (byte *)0x0)) {
                while ((uVar17 = (ulong)*pbVar8, 0x2c < uVar17 ||
                       ((0x100900000201U >> (uVar17 & 0x3f) & 1) == 0))) {
                  pbVar8 = pbVar8 + 1;
                }
LAB_001110ce:
                bVar2 = (byte)uVar17;
                if (0x2e < bVar2) {
LAB_001110f0:
                  if ((byte)(bVar2 - 0x3a) < 0xf6) goto LAB_001110c8;
                  goto LAB_0011110c;
                }
                if ((0x680000000001U >> (uVar17 & 0x3f) & 1) == 0) {
                  if (uVar17 != 0x23) goto LAB_001110f0;
                  *pbVar8 = 0;
                }
                else {
                  local_c78 = pbVar8;
                  if (bVar2 != 0) goto LAB_0011110c;
                }
                pcVar15 = "Syntax error reading face number on line";
LAB_001112b2:
                printf(pcVar15);
                pcVar15 = " %d in file %s\n";
                goto LAB_00111370;
              }
              local_c70 = 0;
            }
          }
          goto LAB_00111153;
        }
        iVar3 = (int)local_c48;
        if ((int)local_c60 <= iVar3) {
          if ((int)uVar4 < (int)local_c70) {
            pfVar13 = local_c50->facetlist;
            pfVar13[(int)uVar4].polygonlist = (polygon *)0x0;
            pfVar13[(int)uVar4].holelist = (double *)0x0;
            pfVar13[(int)uVar4].numberofholes = 0;
            pfVar13[(int)uVar4].numberofpolygons = 1;
            ppVar9 = (polygon *)operator_new__(0x10);
            pfVar13[(int)uVar4].polygonlist = ppVar9;
            ppVar9->vertexlist = (int *)0x0;
            ppVar9->numberofvertices = 0;
            lVar16 = strtol((char *)pbVar6,(char **)&local_c78,0);
            iVar3 = (int)lVar16;
            ppVar9->numberofvertices = iVar3;
            if (iVar3 == 0) {
LAB_00111275:
              pcVar15 = "Syntax error reading polygon on line %d in file %s\n";
LAB_0011127c:
              printf(pcVar15,(ulong)uVar14,local_c38);
              __stream = local_c58;
              goto LAB_00111292;
            }
            uVar17 = (lVar16 << 0x20) >> 0x1e;
            if (lVar16 << 0x20 < 0) {
              uVar17 = 0xffffffffffffffff;
            }
            piVar10 = (int *)operator_new__(uVar17);
            ppVar9->vertexlist = piVar10;
            if (0 < iVar3) {
              lVar16 = 0;
              pbVar6 = local_c78;
              uVar4 = local_c7c;
              do {
                while ((uVar17 = (ulong)*pbVar6, 0x2c < uVar17 ||
                       ((0x100900000201U >> (uVar17 & 0x3f) & 1) == 0))) {
                  pbVar6 = pbVar6 + 1;
                }
LAB_00110f43:
                bVar2 = (byte)uVar17;
                if (0x2e < bVar2) {
LAB_00110f64:
                  if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_00110f7e;
                  uVar17 = (ulong)pbVar6[1];
                  pbVar6 = pbVar6 + 1;
                  goto LAB_00110f43;
                }
                if ((0x680000000001U >> (uVar17 & 0x3f) & 1) == 0) {
                  if (uVar17 == 0x23) {
                    *pbVar6 = 0;
                    goto LAB_00111275;
                  }
                  goto LAB_00110f64;
                }
                local_c78 = pbVar6;
                if (bVar2 == 0) goto LAB_00111275;
LAB_00110f7e:
                local_c78 = pbVar6;
                lVar11 = strtol((char *)pbVar6,(char **)&local_c78,0);
                local_c7c = (uint)lVar11;
                ppVar9->vertexlist[lVar16] = local_c7c;
                if ((int)uVar4 < (int)local_c7c) {
                  local_c7c = uVar4;
                }
                lVar16 = lVar16 + 1;
                pbVar6 = local_c78;
                uVar4 = local_c7c;
              } while (lVar16 < ppVar9->numberofvertices);
            }
            local_c3c = local_c3c + 1;
            __stream = local_c58;
            iVar3 = local_c64;
            goto LAB_001111e4;
          }
          printf("Found extra text starting at line %d in file %s\n",(ulong)uVar14,local_c38);
          goto LAB_001112dd;
        }
        pdVar12 = local_c50->pointlist;
        uVar17 = (ulong)*pbVar6;
        lVar16 = 0;
        do {
          local_c78 = pbVar6;
          if ((char)uVar17 == '\0') {
            pcVar15 = "Syntax error reading vertex coords on line %d in file %s\n";
            goto LAB_0011127c;
          }
          dVar18 = strtod((char *)pbVar6,(char **)&local_c78);
          pdVar12[iVar3 * 3 + lVar16] = dVar18;
          pbVar6 = local_c78;
          while ((uVar17 = (ulong)*pbVar6, 0x2c < uVar17 ||
                 ((0x100900000201U >> (uVar17 & 0x3f) & 1) == 0))) {
            pbVar6 = pbVar6 + 1;
          }
LAB_00110de1:
          if (0x2e < (byte)uVar17) {
LAB_00110dfe:
            if (0xf5 < (byte)((byte)uVar17 - 0x3a)) goto LAB_00110e0f;
            uVar17 = (ulong)pbVar6[1];
            pbVar6 = pbVar6 + 1;
            goto LAB_00110de1;
          }
          if ((0x680000000001U >> (uVar17 & 0x3f) & 1) != 0) goto LAB_00110e0f;
          if (uVar17 != 0x23) goto LAB_00110dfe;
          *pbVar6 = 0;
          uVar17 = 0;
LAB_00110e0f:
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        local_c48 = (ulong)((int)local_c48 + 1);
        __stream = local_c58;
        iVar3 = local_c64;
        local_c78 = pbVar6;
        goto LAB_001111e4;
      }
LAB_001112dd:
      fclose(__stream);
      if (local_c7c < 2) {
        local_c50->firstnumber = local_c7c;
        if ((int)local_c48 == (int)local_c60) {
          if ((int)uVar17 == (int)local_c70) {
            return true;
          }
          pcVar15 = "Expected %d faces, but read only %d faces in file %s\n";
          lVar16 = local_c70;
        }
        else {
          pcVar15 = "Expected %d vertices, but read only %d vertices in file %s\n";
          uVar17 = local_c48;
          lVar16 = local_c60;
        }
        printf(pcVar15,lVar16,uVar17,local_c38);
      }
      else {
        printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)local_c7c,local_c38);
      }
    }
  }
  return false;
LAB_001110c8:
  uVar17 = (ulong)pbVar8[1];
  pbVar8 = pbVar8 + 1;
  goto LAB_001110ce;
LAB_0011110c:
  local_c78 = pbVar8;
  local_c70 = strtol((char *)pbVar8,(char **)&local_c78,0);
  ptVar1 = local_c50;
  uVar4 = (uint)local_c70;
  if (0 < (int)uVar4) {
    local_c50->numberoffacets = uVar4;
    pfVar13 = (facet *)operator_new__((ulong)(uVar4 & 0x7fffffff) << 5);
    ptVar1->facetlist = pfVar13;
  }
LAB_00111153:
  pbVar6 = local_c78;
  if (local_c64 == 0) {
    pbVar8 = (byte *)strstr((char *)local_c78,"format");
    if ((pbVar8 == (byte *)0x0) &&
       (pbVar8 = (byte *)strstr((char *)pbVar6,"Format"), pbVar8 == (byte *)0x0)) {
      iVar3 = 0;
      goto LAB_001111e4;
    }
    while ((uVar17 = (ulong)*pbVar8, 0x3b < uVar17 ||
           ((0x800100100000201U >> (uVar17 & 0x3f) & 1) == 0))) {
      pbVar8 = pbVar8 + 1;
    }
    while (((byte)uVar17 < 0x3c && ((0x800100100000200U >> (uVar17 & 0x3f) & 1) != 0))) {
      pbVar6 = pbVar8 + 1;
      pbVar8 = pbVar8 + 1;
      uVar17 = (ulong)*pbVar6;
    }
    local_c78 = pbVar8;
    pcVar15 = strstr((char *)pbVar8,"ascii");
    if (pcVar15 == (char *)0x0) {
      pcVar15 = strstr((char *)pbVar8,"ASCII");
      iVar3 = 1;
      if (pcVar15 == (char *)0x0) {
        puts("This routine only reads ascii format of ply files.");
        puts("Hint: You can convert the binary to ascii format by");
        puts("  using the provided ply tools:");
        printf("  ply2ascii < %s > ascii_%s\n",local_c38);
LAB_00111292:
        fclose(__stream);
        return false;
      }
      goto LAB_001111e4;
    }
  }
  iVar3 = 1;
LAB_001111e4:
  pbVar6 = (byte *)fgets(local_838,0x7ff,__stream);
  uVar17 = (ulong)local_c3c;
  local_c64 = iVar3;
joined_r0x0011120b:
  uVar14 = uVar14 + 1;
  if (pbVar6 == (byte *)0x0) goto LAB_001112dd;
  goto LAB_00110be7;
}

Assistant:

bool tetgenio::load_ply(char* filebasename)
{
  FILE *fp;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char buffer[INPUTLINESIZE];
  char *bufferp, *str;
  double *coord;
  int endheader = 0, format = 0;
  int nverts = 0, iverts = 0;
  int nfaces = 0, ifaces = 0;
  int line_count = 0, i;

  // Default, the ply file's index is from '0'. We check it by remembering the
  //   smallest index we found in the file. It should be either 0 or 1.
  int smallestidx = 0; 

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 4], ".ply") != 0) {
    strcat(infilename, ".ply");
  }

  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  while ((bufferp = readline(buffer, fp, &line_count)) != NULL) {
    if (!endheader) {
      // Find if it is the keyword "end_header".
      str = strstr(bufferp, "end_header");
      // strstr() is case sensitive.
      if (!str) str = strstr(bufferp, "End_header");
      if (!str) str = strstr(bufferp, "End_Header");
      if (str) {
        // This is the end of the header section.
        endheader = 1; 
        continue;
      }
      // Parse the number of vertices and the number of faces.
      if (nverts == 0 || nfaces == 0) {
        // Find if it si the keyword "element".
        str = strstr(bufferp, "element");
        if (!str) str = strstr(bufferp, "Element");
        if (str) {
          bufferp = findnextfield(str);
          if (*bufferp == '\0') {
            printf("Syntax error reading element type on line%d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          if (nverts == 0) {
            // Find if it is the keyword "vertex".
            str = strstr(bufferp, "vertex");
            if (!str) str = strstr(bufferp, "Vertex");
            if (str) {
              bufferp = findnextnumber(str);
              if (*bufferp == '\0') {
                printf("Syntax error reading vertex number on line");
                printf(" %d in file %s\n", line_count, infilename);
                fclose(fp);
                return false;
              }
              nverts = (int) strtol(bufferp, &bufferp, 0);
              // Allocate memory for 'tetgenio'
              if (nverts > 0) {
                numberofpoints = nverts;
                pointlist = new REAL[nverts * 3];
                smallestidx = nverts + 1; // A big enough index.
              }
            }
          }
          if (nfaces == 0) {
            // Find if it is the keyword "face".
            str = strstr(bufferp, "face");
            if (!str) str = strstr(bufferp, "Face");
            if (str) {
              bufferp = findnextnumber(str);
              if (*bufferp == '\0') {
                printf("Syntax error reading face number on line");
                printf(" %d in file %s\n", line_count, infilename);
                fclose(fp);
                return false;
              }
              nfaces = (int) strtol(bufferp, &bufferp, 0);
              // Allocate memory for 'tetgenio'
              if (nfaces > 0) {        
                numberoffacets = nfaces;
                facetlist = new tetgenio::facet[nfaces];
              }
            }
          }
        } // It is not the string "element". 
      }
      if (format == 0) {
        // Find the keyword "format".
        str = strstr(bufferp, "format");
        if (!str) str = strstr(bufferp, "Format");
        if (str) {
          format = 1;
          bufferp = findnextfield(str);
          // Find if it is the string "ascii".
          str = strstr(bufferp, "ascii");
          if (!str) str = strstr(bufferp, "ASCII");
          if (!str) {
            printf("This routine only reads ascii format of ply files.\n");
            printf("Hint: You can convert the binary to ascii format by\n");
            printf("  using the provided ply tools:\n");
            printf("  ply2ascii < %s > ascii_%s\n", infilename, infilename);
            fclose(fp);
            return false;
          }
        }
      }
    } else if (iverts < nverts) {
      // Read vertex coordinates
      coord = &pointlist[iverts * 3];
      for (i = 0; i < 3; i++) {
        if (*bufferp == '\0') {
          printf("Syntax error reading vertex coords on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        coord[i] = (REAL) strtod(bufferp, &bufferp);
        bufferp = findnextnumber(bufferp);
      }
      iverts++;
    } else if (ifaces < nfaces) {
      // Get next face
      f = &facetlist[ifaces];
      init(f);      
      // In .off format, each facet has one polygon, no hole.
      f->numberofpolygons = 1;
      f->polygonlist = new tetgenio::polygon[1];
      p = &f->polygonlist[0];
      init(p);
      // Read the number of vertices, it should be greater than 0.
      p->numberofvertices = (int) strtol(bufferp, &bufferp, 0);
      if (p->numberofvertices == 0) {
        printf("Syntax error reading polygon on line %d in file %s\n",
               line_count, infilename);
        fclose(fp);
        return false;
      }
      // Allocate memory for face vertices
      p->vertexlist = new int[p->numberofvertices];
      for (i = 0; i < p->numberofvertices; i++) {
        bufferp = findnextnumber(bufferp);
        if (*bufferp == '\0') {
          printf("Syntax error reading polygon on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        p->vertexlist[i] = (int) strtol(bufferp, &bufferp, 0);
        if (p->vertexlist[i] < smallestidx) {
          smallestidx = p->vertexlist[i];
        }
      }
      ifaces++;
    } else {
      // Should never get here
      printf("Found extra text starting at line %d in file %s\n", line_count,
             infilename);
      break;
    }
  }

  // Close file
  fclose(fp);

  // Decide the firstnumber of the index.
  if (smallestidx == 0) {
    firstnumber = 0;  
  } else if (smallestidx == 1) {
    firstnumber = 1;
  } else {
    printf("A wrong smallest index (%d) was detected in file %s\n",
           smallestidx, infilename);
    return false;
  }

  if (iverts != nverts) {
    printf("Expected %d vertices, but read only %d vertices in file %s\n",
           nverts, iverts, infilename);
    return false;
  }
  if (ifaces != nfaces) {
    printf("Expected %d faces, but read only %d faces in file %s\n",
           nfaces, ifaces, infilename);
    return false;
  }

  return true;
}